

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void __thiscall
DynamicInitializationTemplateExpander::DynamicInitializationTemplateExpander
          (DynamicInitializationTemplateExpander *this)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  Template *tpl;
  allocator local_161;
  TemplateString local_160;
  char *local_140;
  undefined8 uStack_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  char *local_120;
  size_t sStack_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  TemplateId TStack_108;
  char *local_100;
  size_t sStack_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  TemplateId TStack_e8;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&dict,"hi {{VAR}} lo");
  tpl = (Template *)ctemplate::Template::StringToTemplate((TemplateString *)&dict,STRIP_WHITESPACE);
  ctemplate::TemplateString::TemplateString(&local_160,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_160,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_a0,"VAR");
  local_140 = "short-lived";
  uStack_138 = 5;
  local_130 = 1;
  uStack_128 = 0;
  TVar4._17_7_ = uStack_12f;
  TVar4.is_immutable_ = true;
  TVar1.length_ = local_a0.length_;
  TVar1.ptr_ = local_a0.ptr_;
  TVar1.is_immutable_ = local_a0.is_immutable_;
  TVar1._17_7_ = local_a0._17_7_;
  TVar1.id_ = local_a0.id_;
  TVar4.length_ = 5;
  TVar4.ptr_ = "short-lived";
  TVar4.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar4);
  std::__cxx11::string::string((string *)&local_160,"hi short lo",&local_161);
  ctemplate::AssertExpandIs(tpl,&dict,(string *)&local_160,true);
  std::__cxx11::string::~string((string *)&local_160);
  ctemplate::TemplateString::TemplateString(&local_c0,"VAR");
  local_100 = kHello.do_not_use_directly_.ptr_;
  sStack_f8 = kHello.do_not_use_directly_.length_;
  local_f0 = 1;
  TStack_e8 = kHello.do_not_use_directly_.id_;
  TVar5._17_7_ = uStack_ef;
  TVar5.is_immutable_ = true;
  TVar2.length_ = local_c0.length_;
  TVar2.ptr_ = local_c0.ptr_;
  TVar2.is_immutable_ = local_c0.is_immutable_;
  TVar2._17_7_ = local_c0._17_7_;
  TVar2.id_ = local_c0.id_;
  TVar5.length_ = kHello.do_not_use_directly_.length_;
  TVar5.ptr_ = kHello.do_not_use_directly_.ptr_;
  TVar5.id_ = kHello.do_not_use_directly_.id_;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar5);
  std::__cxx11::string::string((string *)&local_160,"hi Hello lo",&local_161);
  ctemplate::AssertExpandIs(tpl,&dict,(string *)&local_160,true);
  std::__cxx11::string::~string((string *)&local_160);
  ctemplate::TemplateString::TemplateString(&local_e0,"VAR");
  local_120 = kLateDefine.do_not_use_directly_.ptr_;
  sStack_118 = kLateDefine.do_not_use_directly_.length_;
  local_110 = 1;
  TStack_108 = kLateDefine.do_not_use_directly_.id_;
  TVar6._17_7_ = uStack_10f;
  TVar6.is_immutable_ = true;
  TVar3.length_ = local_e0.length_;
  TVar3.ptr_ = local_e0.ptr_;
  TVar3.is_immutable_ = local_e0.is_immutable_;
  TVar3._17_7_ = local_e0._17_7_;
  TVar3.id_ = local_e0.id_;
  TVar6.length_ = kLateDefine.do_not_use_directly_.length_;
  TVar6.ptr_ = kLateDefine.do_not_use_directly_.ptr_;
  TVar6.id_ = kLateDefine.do_not_use_directly_.id_;
  ctemplate::TemplateDictionary::SetValue(TVar3,TVar6);
  std::__cxx11::string::string((string *)&local_160,"hi laterz lo",&local_161);
  ctemplate::AssertExpandIs(tpl,&dict,(string *)&local_160,true);
  std::__cxx11::string::~string((string *)&local_160);
  if (tpl != (Template *)0x0) {
    (**(code **)(*(long *)tpl + 8))(tpl);
  }
  ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
  return;
}

Assistant:

DynamicInitializationTemplateExpander() {
    Template* tpl = Template::StringToTemplate("hi {{VAR}} lo",
                                               STRIP_WHITESPACE);
    TemplateDictionary dict("dict");
    dict.SetValue("VAR", TemplateString("short-lived", strlen("short")));
    AssertExpandIs(tpl, &dict, "hi short lo", true);
    dict.SetValue("VAR", kHello);
    AssertExpandIs(tpl, &dict, "hi Hello lo", true);
    dict.SetValue("VAR", kLateDefine);
    AssertExpandIs(tpl, &dict, "hi laterz lo", true);
    delete tpl;
  }